

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::BeginDockableDragDropTarget(ImGuiWindow *window)

{
  float _x;
  ImGuiWindow *root_payload;
  bool bVar1;
  bool bVar2;
  ImGuiPayload *this;
  ImGuiPayload *pIVar3;
  ImGuiDockNode *host_node;
  void **lhs;
  float _y;
  bool local_31e;
  bool local_31d;
  ImGuiDockNode *local_308;
  ImGuiDockNode *root_node;
  ImGuiDockPreviewData *split_data;
  undefined1 local_2e0 [8];
  ImGuiDockPreviewData split_outer;
  ImGuiDockPreviewData split_inner;
  bool do_preview;
  bool is_explicit_target;
  ImVec2 local_70;
  undefined1 local_68 [8];
  ImRect explicit_target_rect;
  ImGuiDockNode *local_50;
  ImGuiDockNode *node;
  bool dock_into_floating_window;
  ImGuiWindow *payload_window;
  ImGuiPayload *payload;
  ImGuiContext *local_20;
  ImGuiContext *g;
  ImGuiContext *ctx;
  ImGuiWindow *window_local;
  
  g = GImGui;
  local_20 = GImGui;
  ctx = (ImGuiContext *)window;
  if ((window->Flags & 0x200000U) != 0) {
    __assert_fail("(window->Flags & ImGuiWindowFlags_NoDocking) == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O0/_deps/imgui-src/imgui.cpp"
                  ,0x4295,"void ImGui::BeginDockableDragDropTarget(ImGuiWindow *)");
  }
  if ((GImGui->DragDropActive & 1U) != 0) {
    _payload = ImGuiWindow::Rect(window);
    bVar1 = BeginDragDropTargetCustom((ImRect *)&payload,(ctx->IO).ConfigFlags);
    if (((bVar1 ^ 0xffU) & 1) == 0) {
      this = &local_20->DragDropPayload;
      bVar1 = ImGuiPayload::IsDataType(this,"_IMWINDOW");
      if ((bVar1) && (bVar1 = DockNodeIsDropAllowed((ImGuiWindow *)ctx,*this->Data), bVar1)) {
        root_payload = *this->Data;
        pIVar3 = AcceptDragDropPayload("_IMWINDOW",0xc00);
        if (pIVar3 != (ImGuiPayload *)0x0) {
          bVar1 = false;
          local_50 = (ImGuiDockNode *)0x0;
          if (*(long *)((ctx->IO).KeyMap + 200) == 0) {
            bVar1 = *(long *)((ctx->IO).KeyMap + 0xc6) == 0;
            if (!bVar1) {
              local_50 = *(ImGuiDockNode **)((ctx->IO).KeyMap + 0xc6);
            }
          }
          else {
            explicit_target_rect.Max = (local_20->IO).MousePos;
            local_50 = DockNodeTreeFindVisibleNodeByPos
                                 (*(ImGuiDockNode **)((ctx->IO).KeyMap + 200),
                                  explicit_target_rect.Max);
            if (((local_50 != (ImGuiDockNode *)0x0) &&
                (bVar2 = ImGuiDockNode::IsDockSpace(local_50), bVar2)) &&
               (bVar2 = ImGuiDockNode::IsRootNode(local_50), bVar2)) {
              if ((local_50->CentralNode == (ImGuiDockNode *)0x0) ||
                 (bVar2 = ImGuiDockNode::IsLeafNode(local_50), !bVar2)) {
                local_308 = DockNodeTreeFindFallbackLeafNode(local_50);
              }
              else {
                local_308 = local_50->CentralNode;
              }
              local_50 = local_308;
            }
          }
          if (((local_50 == (ImGuiDockNode *)0x0) || (local_50->TabBar == (ImGuiTabBar *)0x0)) ||
             ((bVar2 = ImGuiDockNode::IsHiddenTabBar(local_50), bVar2 ||
              (bVar2 = ImGuiDockNode::IsNoTabBar(local_50), bVar2)))) {
            lhs = &(ctx->IO).UserData;
            _x = *(float *)&(ctx->IO).Fonts;
            _y = GetFrameHeight();
            ImVec2::ImVec2((ImVec2 *)&stack0xffffffffffffff88,_x,_y);
            local_70 = ::operator+((ImVec2 *)lhs,(ImVec2 *)&stack0xffffffffffffff88);
            ImRect::ImRect((ImRect *)local_68,(ImVec2 *)lhs,&local_70);
          }
          else {
            local_68 = *(undefined1 (*) [8])&(local_50->TabBar->BarRect).Min;
            explicit_target_rect.Min = (local_50->TabBar->BarRect).Max;
          }
          local_31d = true;
          if (((local_20->IO).ConfigDockingWithShift & 1U) == 0) {
            local_31d = IsMouseHoveringRect((ImVec2 *)local_68,&explicit_target_rect.Min,true);
          }
          bVar2 = ImGuiPayload::IsPreview(this);
          local_31e = true;
          if (!bVar2) {
            local_31e = ImGuiPayload::IsDelivery(this);
          }
          if ((local_31e != false) && ((local_50 != (ImGuiDockNode *)0x0 || (bVar1)))) {
            ImGuiDockPreviewData::ImGuiDockPreviewData
                      ((ImGuiDockPreviewData *)&split_outer.DropRectsDraw[4].Max);
            ImGuiDockPreviewData::ImGuiDockPreviewData((ImGuiDockPreviewData *)local_2e0);
            root_node = (ImGuiDockNode *)&split_outer.DropRectsDraw[4].Max;
            if ((local_50 != (ImGuiDockNode *)0x0) &&
               ((((local_50->ParentNode != (ImGuiDockNode *)0x0 ||
                  (bVar1 = ImGuiDockNode::IsCentralNode(local_50), bVar1)) &&
                 (host_node = DockNodeGetRootNode(local_50), host_node != (ImGuiDockNode *)0x0)) &&
                (DockNodePreviewDockSetup
                           ((ImGuiWindow *)ctx,host_node,root_payload,
                            (ImGuiDockPreviewData *)local_2e0,local_31d,true),
                (split_outer.FutureNode.WantCloseTabId._3_1_ & 1) != 0)))) {
              root_node = (ImGuiDockNode *)local_2e0;
            }
            DockNodePreviewDockSetup
                      ((ImGuiWindow *)ctx,local_50,root_payload,
                       (ImGuiDockPreviewData *)&split_outer.DropRectsDraw[4].Max,local_31d,false);
            DockNodePreviewDockRender
                      ((ImGuiWindow *)ctx,local_50,root_payload,
                       (ImGuiDockPreviewData *)&split_outer.DropRectsDraw[4].Max);
            DockNodePreviewDockRender
                      ((ImGuiWindow *)ctx,local_50,root_payload,(ImGuiDockPreviewData *)local_2e0);
            if (((root_node[1].ID & 1) != 0) && (bVar1 = ImGuiPayload::IsDelivery(this), bVar1)) {
              DockContextQueueDock
                        (g,(ImGuiWindow *)ctx,*(ImGuiDockNode **)&root_node[1].LocalFlags,
                         root_payload,root_node[1].MergedFlags,(float)root_node[1].State,
                         root_node == (ImGuiDockNode *)local_2e0);
            }
            ImGuiDockPreviewData::~ImGuiDockPreviewData((ImGuiDockPreviewData *)local_2e0);
            ImGuiDockPreviewData::~ImGuiDockPreviewData
                      ((ImGuiDockPreviewData *)&split_outer.DropRectsDraw[4].Max);
          }
        }
        EndDragDropTarget();
      }
      else {
        EndDragDropTarget();
      }
    }
  }
  return;
}

Assistant:

void ImGui::BeginDockableDragDropTarget(ImGuiWindow* window)
{
    ImGuiContext* ctx = GImGui;
    ImGuiContext& g = *ctx;

    //IM_ASSERT(window->RootWindowDockTree == window); // May also be a DockSpace
    IM_ASSERT((window->Flags & ImGuiWindowFlags_NoDocking) == 0);
    if (!g.DragDropActive)
        return;
    //GetForegroundDrawList(window)->AddRect(window->Pos, window->Pos + window->Size, IM_COL32(255, 255, 0, 255));
    if (!BeginDragDropTargetCustom(window->Rect(), window->ID))
        return;

    // Peek into the payload before calling AcceptDragDropPayload() so we can handle overlapping dock nodes with filtering
    // (this is a little unusual pattern, normally most code would call AcceptDragDropPayload directly)
    const ImGuiPayload* payload = &g.DragDropPayload;
    if (!payload->IsDataType(IMGUI_PAYLOAD_TYPE_WINDOW) || !DockNodeIsDropAllowed(window, *(ImGuiWindow**)payload->Data))
    {
        EndDragDropTarget();
        return;
    }

    ImGuiWindow* payload_window = *(ImGuiWindow**)payload->Data;
    if (AcceptDragDropPayload(IMGUI_PAYLOAD_TYPE_WINDOW, ImGuiDragDropFlags_AcceptBeforeDelivery | ImGuiDragDropFlags_AcceptNoDrawDefaultRect))
    {
        // Select target node
        // (Important: we cannot use g.HoveredDockNode here! Because each of our target node have filters based on payload, each candidate drop target will do its own evaluation)
        bool dock_into_floating_window = false;
        ImGuiDockNode* node = NULL;
        if (window->DockNodeAsHost)
        {
            // Cannot assume that node will != NULL even though we passed the rectangle test: it depends on padding/spacing handled by DockNodeTreeFindVisibleNodeByPos().
            node = DockNodeTreeFindVisibleNodeByPos(window->DockNodeAsHost, g.IO.MousePos);

            // There is an edge case when docking into a dockspace which only has _inactive_ nodes (because none of the windows are active)
            // In this case we need to fallback into any leaf mode, possibly the central node.
            // FIXME-20181220: We should not have to test for IsLeafNode() here but we have another bug to fix first.
            if (node && node->IsDockSpace() && node->IsRootNode())
                node = (node->CentralNode && node->IsLeafNode()) ? node->CentralNode : DockNodeTreeFindFallbackLeafNode(node);
        }
        else
        {
            if (window->DockNode)
                node = window->DockNode;
            else
                dock_into_floating_window = true; // Dock into a regular window
        }

        const ImRect explicit_target_rect = (node && node->TabBar && !node->IsHiddenTabBar() && !node->IsNoTabBar()) ? node->TabBar->BarRect : ImRect(window->Pos, window->Pos + ImVec2(window->Size.x, GetFrameHeight()));
        const bool is_explicit_target = g.IO.ConfigDockingWithShift || IsMouseHoveringRect(explicit_target_rect.Min, explicit_target_rect.Max);

        // Preview docking request and find out split direction/ratio
        //const bool do_preview = true;     // Ignore testing for payload->IsPreview() which removes one frame of delay, but breaks overlapping drop targets within the same window.
        const bool do_preview = payload->IsPreview() || payload->IsDelivery();
        if (do_preview && (node != NULL || dock_into_floating_window))
        {
            ImGuiDockPreviewData split_inner;
            ImGuiDockPreviewData split_outer;
            ImGuiDockPreviewData* split_data = &split_inner;
            if (node && (node->ParentNode || node->IsCentralNode()))
                if (ImGuiDockNode* root_node = DockNodeGetRootNode(node))
                {
                    DockNodePreviewDockSetup(window, root_node, payload_window, &split_outer, is_explicit_target, true);
                    if (split_outer.IsSplitDirExplicit)
                        split_data = &split_outer;
                }
            DockNodePreviewDockSetup(window, node, payload_window, &split_inner, is_explicit_target, false);
            if (split_data == &split_outer)
                split_inner.IsDropAllowed = false;

            // Draw inner then outer, so that previewed tab (in inner data) will be behind the outer drop boxes
            DockNodePreviewDockRender(window, node, payload_window, &split_inner);
            DockNodePreviewDockRender(window, node, payload_window, &split_outer);

            // Queue docking request
            if (split_data->IsDropAllowed && payload->IsDelivery())
                DockContextQueueDock(ctx, window, split_data->SplitNode, payload_window, split_data->SplitDir, split_data->SplitRatio, split_data == &split_outer);
        }
    }
    EndDragDropTarget();
}